

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpush.c
# Opt level: O0

int nn_xpush_create(void *hint,nn_sockbase **sockbase)

{
  nn_sockbase_vfptr *vfptr;
  nn_xpush *in_RSI;
  nn_xpush *self;
  
  vfptr = (nn_sockbase_vfptr *)nn_alloc_(0x2f4788);
  if (vfptr == (nn_sockbase_vfptr *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/pipeline/xpush.c"
            ,0xa8);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_xpush_init(in_RSI,vfptr,(void *)0x2f47f7);
  (in_RSI->sockbase).vfptr = vfptr;
  return 0;
}

Assistant:

int nn_xpush_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_xpush *self;

    self = nn_alloc (sizeof (struct nn_xpush), "socket (push)");
    alloc_assert (self);
    nn_xpush_init (self, &nn_xpush_sockbase_vfptr, hint);
    *sockbase = &self->sockbase;

    return 0;
}